

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_astData *
MOJOSHADER_parseAst(char *srcprofile,char *filename,char *source,uint sourcelen,
                   MOJOSHADER_preprocessorDefine *defs,uint define_count,
                   MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close,
                   MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Context_conflict *ctx;
  MOJOSHADER_astData *pMVar7;
  MOJOSHADER_error *pMVar8;
  MOJOSHADER_astData *pMVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (((m != (MOJOSHADER_malloc)0x0 || f == (MOJOSHADER_free)0x0) &&
      (m == (MOJOSHADER_malloc)0x0 || f != (MOJOSHADER_free)0x0)) &&
     (ctx = build_context(m,f,d), ctx != (Context_conflict *)0x0)) {
    choose_src_profile(ctx,srcprofile);
    if ((ctx->isfail != 0) ||
       (parse_source(ctx,filename,source,sourcelen,defs,define_count,include_open,include_close),
       ctx->isfail != 0)) {
      pMVar9 = &MOJOSHADER_out_of_mem_ast_data;
      if ((ctx->out_of_memory == 0) &&
         (pMVar7 = (MOJOSHADER_astData *)Malloc(ctx,0x40), pMVar7 != (MOJOSHADER_astData *)0x0)) {
        pMVar7->malloc_data = (void *)0x0;
        pMVar7->opaque = (void *)0x0;
        pMVar7->malloc = (MOJOSHADER_malloc)0x0;
        pMVar7->free = (MOJOSHADER_free)0x0;
        pMVar7->source_profile = (char *)0x0;
        pMVar7->ast = (MOJOSHADER_astNode *)0x0;
        *(undefined8 *)pMVar7 = 0;
        pMVar7->errors = (MOJOSHADER_error *)0x0;
        pMVar7->source_profile = ctx->source_profile;
        uVar3 = *(uint *)((long)&ctx->malloc + 4);
        uVar4 = *(uint *)&ctx->free;
        uVar5 = *(uint *)((long)&ctx->free + 4);
        uVar11 = -(uint)(*(uint *)&ctx->malloc == 0x11c9d4);
        uVar12 = -(uint)(uVar3 == 0);
        uVar13 = -(uint)(uVar4 == 0x11c9dc);
        uVar14 = -(uint)(uVar5 == 0);
        *(uint *)&pMVar7->malloc = ~(uVar12 & uVar11) & *(uint *)&ctx->malloc;
        *(uint *)((long)&pMVar7->malloc + 4) = ~(uVar11 & uVar12) & uVar3;
        *(uint *)&pMVar7->free = ~(uVar14 & uVar13) & uVar4;
        *(uint *)((long)&pMVar7->free + 4) = ~(uVar13 & uVar14) & uVar5;
        pMVar7->malloc_data = ctx->malloc_data;
        iVar6 = errorlist_count(ctx->errors);
        pMVar7->error_count = iVar6;
        pMVar8 = errorlist_flatten(ctx->errors);
        pMVar7->errors = pMVar8;
        pMVar9 = pMVar7;
        if (ctx->out_of_memory != 0) {
          (*ctx->free)(pMVar7,ctx->malloc_data);
          pMVar9 = &MOJOSHADER_out_of_mem_ast_data;
        }
      }
      destroy_context(ctx);
      return pMVar9;
    }
    if ((ctx->out_of_memory == 0) &&
       (pMVar9 = (MOJOSHADER_astData *)Malloc(ctx,0x40), pMVar9 != (MOJOSHADER_astData *)0x0)) {
      pMVar9->malloc_data = (void *)0x0;
      pMVar9->opaque = (void *)0x0;
      pMVar9->malloc = (MOJOSHADER_malloc)0x0;
      pMVar9->free = (MOJOSHADER_free)0x0;
      pMVar9->source_profile = (char *)0x0;
      pMVar9->ast = (MOJOSHADER_astNode *)0x0;
      *(undefined8 *)pMVar9 = 0;
      pMVar9->errors = (MOJOSHADER_error *)0x0;
      uVar3 = *(uint *)((long)&ctx->malloc + 4);
      uVar4 = *(uint *)&ctx->free;
      uVar5 = *(uint *)((long)&ctx->free + 4);
      uVar11 = -(uint)(*(uint *)&ctx->malloc == 0x11c9d4);
      uVar12 = -(uint)(uVar3 == 0);
      uVar13 = -(uint)(uVar4 == 0x11c9dc);
      uVar14 = -(uint)(uVar5 == 0);
      *(uint *)&pMVar9->malloc = ~(uVar12 & uVar11) & *(uint *)&ctx->malloc;
      *(uint *)((long)&pMVar9->malloc + 4) = ~(uVar11 & uVar12) & uVar3;
      *(uint *)&pMVar9->free = ~(uVar14 & uVar13) & uVar4;
      *(uint *)((long)&pMVar9->free + 4) = ~(uVar13 & uVar14) & uVar5;
      pMVar9->malloc_data = ctx->malloc_data;
      if (ctx->isfail == 0) {
        uVar1 = ctx->ast;
        uVar2 = ctx->source_profile;
        auVar10._8_4_ = (int)uVar1;
        auVar10._0_8_ = uVar2;
        auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
        pMVar9->source_profile = (char *)uVar2;
        pMVar9->ast = (MOJOSHADER_astNode *)auVar10._8_8_;
      }
      iVar6 = errorlist_count(ctx->errors);
      pMVar9->error_count = iVar6;
      pMVar8 = errorlist_flatten(ctx->errors);
      pMVar9->errors = pMVar8;
      if (ctx->out_of_memory == 0) {
        pMVar9->opaque = ctx;
        return pMVar9;
      }
      (*ctx->free)(pMVar9,ctx->malloc_data);
    }
  }
  return &MOJOSHADER_out_of_mem_ast_data;
}

Assistant:

const MOJOSHADER_astData *MOJOSHADER_parseAst(const char *srcprofile,
                                    const char *filename, const char *source,
                                    unsigned int sourcelen,
                                    const MOJOSHADER_preprocessorDefine *defs,
                                    unsigned int define_count,
                                    MOJOSHADER_includeOpen include_open,
                                    MOJOSHADER_includeClose include_close,
                                    MOJOSHADER_malloc m, MOJOSHADER_free f,
                                    void *d)
{
    const MOJOSHADER_astData *retval = NULL;
    Context *ctx = NULL;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_ast_data;  // supply both or neither.

    ctx = build_context(m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_ast_data;

    choose_src_profile(ctx, srcprofile);

    if (!isfail(ctx))
    {
        parse_source(ctx, filename, source, sourcelen, defs, define_count,
                     include_open, include_close);
    } // if

    if (!isfail(ctx))
        retval = build_astdata(ctx);  // ctx isn't destroyed yet!
    else
    {
        retval = (MOJOSHADER_astData *) build_failed_ast(ctx);
        destroy_context(ctx);
    } // else

    return retval;
}